

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::SonarQubeReporter::writeSection
          (SonarQubeReporter *this,string *rootName,SectionNode *sectionNode,bool okToFail)

{
  XmlWriter *this_00;
  pointer pcVar1;
  pointer pAVar2;
  AssertionStats *stats;
  pointer puVar3;
  StringRef attribute;
  bool bVar4;
  long *plVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  AssertionOrBenchmarkResult *assertionOrBenchmark;
  pointer pAVar7;
  pointer puVar8;
  StringRef name_00;
  StringRef name_01;
  __string_type __str;
  string name;
  undefined1 local_90 [32];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  trim(&local_50,(string *)sectionNode);
  if (rootName->_M_string_length != 0) {
    pcVar1 = (rootName->_M_dataplus)._M_p;
    local_90._0_8_ = (XmlWriter *)(local_90 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,pcVar1,pcVar1 + rootName->_M_string_length);
    std::__cxx11::string::_M_replace_aux((ulong)local_90,local_90._8_8_,0,'\x01');
    plVar5 = (long *)std::__cxx11::string::_M_append(local_90,(ulong)local_50._M_dataplus._M_p);
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 == paVar6) {
      local_60._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_60._8_8_ = plVar5[3];
      local_70._M_p = (pointer)&local_60;
    }
    else {
      local_60._M_allocated_capacity = paVar6->_M_allocated_capacity;
      local_70._M_p = (pointer)*plVar5;
    }
    local_68 = plVar5[1];
    *plVar5 = (long)paVar6;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    if ((XmlWriter *)local_90._0_8_ != (XmlWriter *)(local_90 + 0x10)) {
      operator_delete((void *)local_90._0_8_,
                      (ulong)((long)&((_Alloc_hider *)local_90._16_8_)->_M_p + 1));
    }
  }
  bVar4 = CumulativeReporterBase::SectionNode::hasAnyAssertions(sectionNode);
  if (((bVar4) || ((sectionNode->stdOut)._M_string_length != 0)) ||
     ((sectionNode->stdErr)._M_string_length != 0)) {
    local_70._M_p = (pointer)&local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"testCase","");
    this_00 = &this->xml;
    XmlWriter::scopedElement((XmlWriter *)local_90,(string *)this_00,(XmlFormatting)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p != &local_60) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    attribute.m_size = local_50._M_string_length;
    attribute.m_start = local_50._M_dataplus._M_p;
    name_00.m_size = 4;
    name_00.m_start = "name";
    XmlWriter::writeAttribute(this_00,name_00,attribute);
    local_70._M_p = (pointer)(long)((sectionNode->stats).durationInSeconds * 1000.0);
    name_01.m_size = 8;
    name_01.m_start = "duration";
    XmlWriter::writeAttribute<long,void>(this_00,name_01,(long *)&local_70);
    pAVar2 = (sectionNode->assertionsAndBenchmarks).
             super__Vector_base<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pAVar7 = (sectionNode->assertionsAndBenchmarks).
                  super__Vector_base<Catch::Detail::AssertionOrBenchmarkResult,_std::allocator<Catch::Detail::AssertionOrBenchmarkResult>_>
                  ._M_impl.super__Vector_impl_data._M_start; pAVar7 != pAVar2; pAVar7 = pAVar7 + 1)
    {
      stats = (pAVar7->m_assertion).nullableValue;
      if (stats != (AssertionStats *)0x0) {
        writeAssertion(this,stats,okToFail);
      }
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_90);
  }
  puVar8 = (sectionNode->childSections).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (sectionNode->childSections).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar8 != puVar3) {
    do {
      if (puVar8->m_ptr == (SectionNode *)0x0) {
        __assert_fail("m_ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                      ,0x381,
                      "const T &Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::operator*() const [T = Catch::CumulativeReporterBase::SectionNode]"
                     );
      }
      writeSection(this,&local_50,puVar8->m_ptr,okToFail);
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar3);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SonarQubeReporter::writeSection(std::string const& rootName, SectionNode const& sectionNode, bool okToFail) {
        std::string name = trim(sectionNode.stats.sectionInfo.name);
        if (!rootName.empty())
            name = rootName + '/' + name;

        if ( sectionNode.hasAnyAssertions()
            || !sectionNode.stdOut.empty()
            ||  !sectionNode.stdErr.empty() ) {
            XmlWriter::ScopedElement e = xml.scopedElement("testCase");
            xml.writeAttribute("name"_sr, name);
            xml.writeAttribute("duration"_sr, static_cast<long>(sectionNode.stats.durationInSeconds * 1000));

            writeAssertions(sectionNode, okToFail);
        }

        for (auto const& childNode : sectionNode.childSections)
            writeSection(name, *childNode, okToFail);
    }